

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O2

void __thiscall Sock::Close(Sock *this)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  int iVar3;
  Logger *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int in_stack_fffffffffffffefc;
  string local_d8 [128];
  string local_58;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_socket != 0xffffffff) {
    iVar3 = close(this->m_socket);
    if (iVar3 != 0) {
      __errno_location();
      SysErrorString_abi_cxx11_(in_stack_fffffffffffffefc);
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar4);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<unsigned_int,std::__cxx11::string>
                  (&local_58,(tinyformat *)"Error closing socket %d: %s\n",(char *)&this->m_socket,
                   (uint *)local_d8,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        pLVar4 = LogInstance();
        local_58._M_dataplus._M_p = (pointer)0x56;
        local_58._M_string_length = 0xe61f29;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/sock.cpp"
        ;
        source_file._M_len = 0x56;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "Close";
        logging_function._M_len = 5;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x19c,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string(local_d8);
    }
    this->m_socket = 0xffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Sock::Close()
{
    if (m_socket == INVALID_SOCKET) {
        return;
    }
#ifdef WIN32
    int ret = closesocket(m_socket);
#else
    int ret = close(m_socket);
#endif
    if (ret) {
        LogPrintf("Error closing socket %d: %s\n", m_socket, NetworkErrorString(WSAGetLastError()));
    }
    m_socket = INVALID_SOCKET;
}